

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O1

void __thiscall
glcts::GeometryShaderMaxInputComponentsTest::getShaderParts
          (GeometryShaderMaxInputComponentsTest *this,GLchar ***out_fragment_shader_parts,
          uint *out_n_fragment_shader_parts,GLchar ***out_geometry_shader_parts,
          uint *out_n_geometry_shader_parts,GLchar ***out_vertex_shader_parts,
          uint *out_n_vertex_shader_parts)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  int iVar2;
  stringstream stream;
  long *local_1d8 [2];
  long local_1c8 [2];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  iVar1 = (*((this->super_GeometryShaderLimitsTransformFeedbackBase).super_TestCaseBase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  *out_fragment_shader_parts = &m_fragment_shader_code;
  *out_n_fragment_shader_parts = 1;
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x868))
            ((this->super_GeometryShaderLimitsTransformFeedbackBase).super_TestCaseBase.
             m_glExtTokens.MAX_GEOMETRY_INPUT_COMPONENTS,&this->m_max_geometry_input_components);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"glGetIntegerv() failed for GL_MAX_GEOMETRY_INPUT_COMPONENTS_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0x683);
  iVar1 = this->m_max_geometry_input_components;
  iVar2 = iVar1 + 3;
  if (-1 < iVar1) {
    iVar2 = iVar1;
  }
  this->m_max_geometry_input_vectors = iVar2 >> 2;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::ostream::operator<<(local_1a8,this->m_max_geometry_input_vectors);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&this->m_max_geometry_input_vectors_string,(string *)local_1d8);
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  this->m_geometry_shader_parts[0] =
       "${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout(points)                 in;\nlayout(points, max_vertices=1) out;\n\n// definition of NUMBER_OF_GEOMETRY_INPUT_VECTORS goes here\n"
  ;
  this->m_geometry_shader_parts[1] = "#define NUMBER_OF_GEOMETRY_INPUT_VECTORS ";
  this->m_geometry_shader_parts[2] = (this->m_max_geometry_input_vectors_string)._M_dataplus._M_p;
  this->m_geometry_shader_parts[3] =
       "u\n\nin Vertex\n{\n    flat in ivec4 vs_gs_out[NUMBER_OF_GEOMETRY_INPUT_VECTORS];\n} vertex[1];\n\nflat out int gs_out_sum;\n\nvoid main()\n{\n    gs_out_sum = 0;\n\n    for (uint i = 0u; i < NUMBER_OF_GEOMETRY_INPUT_VECTORS; ++i)\n    {\n        gs_out_sum += vertex[0].vs_gs_out[i].x;\n        gs_out_sum += vertex[0].vs_gs_out[i].y;\n        gs_out_sum += vertex[0].vs_gs_out[i].z;\n        gs_out_sum += vertex[0].vs_gs_out[i].w;\n    }\n    EmitVertex();\n    \n    EndPrimitive();\n}\n"
  ;
  *out_geometry_shader_parts = this->m_geometry_shader_parts;
  *out_n_geometry_shader_parts = 4;
  this->m_vertex_shader_parts[0] =
       "${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n\n// definition of NUMBER_OF_GEOMETRY_INPUT_VECTORS\n"
  ;
  this->m_vertex_shader_parts[1] = "#define NUMBER_OF_GEOMETRY_INPUT_VECTORS ";
  this->m_vertex_shader_parts[2] = (this->m_max_geometry_input_vectors_string)._M_dataplus._M_p;
  this->m_vertex_shader_parts[3] =
       "u\n\nout Vertex\n{   flat out ivec4 vs_gs_out[NUMBER_OF_GEOMETRY_INPUT_VECTORS];\n};\n\nvoid main()\n{\n   int index = 1;\n\n   for (uint i = 0u; i < NUMBER_OF_GEOMETRY_INPUT_VECTORS; ++i)\n   {\n       vs_gs_out[i] = ivec4(index, index + 1, index + 2, index + 3);\n       index       += 4;\n   }\n}\n"
  ;
  *out_vertex_shader_parts = this->m_vertex_shader_parts;
  *out_n_vertex_shader_parts = 4;
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void GeometryShaderMaxInputComponentsTest::getShaderParts(const glw::GLchar* const*& out_fragment_shader_parts,
														  unsigned int&				 out_n_fragment_shader_parts,
														  const glw::GLchar* const*& out_geometry_shader_parts,
														  unsigned int&				 out_n_geometry_shader_parts,
														  const glw::GLchar* const*& out_vertex_shader_parts,
														  unsigned int&				 out_n_vertex_shader_parts)
{
	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Fragment Shader */
	out_fragment_shader_parts   = &m_fragment_shader_code;
	out_n_fragment_shader_parts = 1;

	/* Get maximum number of uniform */
	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_INPUT_COMPONENTS, &m_max_geometry_input_components);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_INPUT_COMPONENTS_EXT pname");

	m_max_geometry_input_vectors = m_max_geometry_input_components / 4 /* 4 components per vector */;

	std::stringstream stream;
	stream << m_max_geometry_input_vectors;
	m_max_geometry_input_vectors_string = stream.str();

	/* Geometry Shader */
	m_geometry_shader_parts[0] = m_geometry_shader_code_preamble;
	m_geometry_shader_parts[1] = m_geometry_shader_code_number_of_uniforms;
	m_geometry_shader_parts[2] = m_max_geometry_input_vectors_string.c_str();
	m_geometry_shader_parts[3] = m_geometry_shader_code_body;

	out_geometry_shader_parts   = m_geometry_shader_parts;
	out_n_geometry_shader_parts = 4;

	/* Vertex Shader */
	m_vertex_shader_parts[0] = m_vertex_shader_code_preamble;
	m_vertex_shader_parts[1] = m_vertex_shader_code_number_of_uniforms;
	m_vertex_shader_parts[2] = m_max_geometry_input_vectors_string.c_str();
	m_vertex_shader_parts[3] = m_vertex_shader_code_body;

	out_vertex_shader_parts   = m_vertex_shader_parts;
	out_n_vertex_shader_parts = 4;
}